

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void Load_Trainer(char *filename,bool *save_with_examples)

{
  char cVar1;
  Am_String *pAVar2;
  Am_Value_List *pAVar3;
  long *plVar4;
  Am_Wrapper *pAVar5;
  Am_Value *pAVar6;
  Am_Value_List class_list;
  Am_Value_List class_names;
  Am_String local_290 [2];
  bool *local_280;
  Am_Object local_278;
  Am_String local_270;
  Am_Value_List local_268 [16];
  Am_Value_List local_258 [16];
  Am_Value_List local_248 [16];
  ifstream in;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,filename,_S_in);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) == 0) {
    local_280 = save_with_examples;
    plVar4 = (long *)operator>>((istream *)&in,(Am_Gesture_Trainer *)&trainer);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      Am_Gesture_Trainer::Get_Class_Names();
      Am_Value_List::Am_Value_List(local_268,&class_names);
      Class_Create_List(&class_list);
      Am_Value_List::~Am_Value_List(local_268);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&class_list);
      Am_Object::Set(0x500,(Am_Wrapper *)0xa2,(ulong)pAVar5);
      Am_Object::Set(0x500,0x169,0);
      *local_280 = false;
      Am_Value_List::Start();
      while( true ) {
        cVar1 = Am_Value_List::Last();
        if (cVar1 != '\0') break;
        pAVar6 = (Am_Value *)Am_Value_List::Get();
        Am_Object::Am_Object(&local_278,pAVar6);
        pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_278,(ulong)(ushort)CLASS_NAME);
        Am_String::Am_String(&local_270,pAVar6);
        Am_Gesture_Trainer::Get_Examples((Am_String_Data *)local_290);
        pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_290);
        Am_Value_List::~Am_Value_List((Am_Value_List *)local_290);
        Am_String::~Am_String(&local_270);
        Am_Object::~Am_Object(&local_278);
        if (pAVar5 != (Am_Wrapper *)0x0) {
          *local_280 = true;
          break;
        }
        Am_Value_List::Next();
      }
      Am_Object::Set(0x550,(Am_String *)0x169,0x110560);
      dirty = false;
      Am_Value_List::~Am_Value_List(&class_list);
      goto LAB_00106542;
    }
    Am_Value_List::Am_Value_List(&class_names);
    Am_String::Am_String((Am_String *)&class_list,filename,true);
    pAVar2 = (Am_String *)
             Am_Value_List::Add((Am_String *)&class_names,(Am_Add_Position)&class_list,true);
    Am_String::Am_String(local_290,"is not a gesture classifier.",true);
    pAVar3 = (Am_Value_List *)Am_Value_List::Add(pAVar2,(Am_Add_Position)local_290,true);
    Am_Value_List::Am_Value_List(local_258,pAVar3);
    Popup_Error(local_258);
    pAVar3 = local_258;
  }
  else {
    Am_Value_List::Am_Value_List(&class_names);
    Am_String::Am_String((Am_String *)&class_list,filename,true);
    pAVar2 = (Am_String *)
             Am_Value_List::Add((Am_String *)&class_names,(Am_Add_Position)&class_list,true);
    Am_String::Am_String(local_290,"can\'t be opened.",true);
    pAVar3 = (Am_Value_List *)Am_Value_List::Add(pAVar2,(Am_Add_Position)local_290,true);
    Am_Value_List::Am_Value_List(local_248,pAVar3);
    Popup_Error(local_248);
    pAVar3 = local_248;
  }
  Am_Value_List::~Am_Value_List(pAVar3);
  Am_String::~Am_String(local_290);
  Am_String::~Am_String((Am_String *)&class_list);
LAB_00106542:
  Am_Value_List::~Am_Value_List(&class_names);
  std::ifstream::~ifstream(&in);
  return;
}

Assistant:

void
Load_Trainer(char *filename, bool &save_with_examples)
{
  ifstream in(filename);
  if (!in) {
    Popup_Error(Am_Value_List()
                    .Add(Am_String(filename))
                    .Add(Am_String("can't be opened.")));
    return;
  }

  if (!(in >> trainer)) {
    Popup_Error(Am_Value_List()
                    .Add(Am_String(filename))
                    .Add(Am_String("is not a gesture classifier.")));
    return;
  }

  Am_Value_List class_names = trainer.Get_Class_Names();
  Am_Value_List class_list = Class_Create_List(class_names);
  class_panel.Set(Am_ITEMS, class_list);
  class_panel.Set(Am_VALUE, 0);

  save_with_examples = false;
  for (class_list.Start(); !class_list.Last(); class_list.Next())
    if (trainer.Get_Examples(Am_Object(class_list.Get()).Get(CLASS_NAME))) {
      save_with_examples = true;
      break;
    }

  mode.Set(Am_VALUE, training_mode);
  dirty = false;
}